

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldst_helper.c
# Opt level: O2

void sparc_raise_mmu_fault
               (CPUState *cs,hwaddr addr,_Bool is_write,_Bool is_exec,int is_asi,uint size,
               uintptr_t retaddr)

{
  int tt;
  undefined7 in_register_00000011;
  
  if ((int)addr == 0) {
    if (((ulong)cs[1].tb_jmp_cache[0x436] & 8) == 0) {
      if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x3059) & 8) == 0) {
        return;
      }
      if (((ulong)cs[1].tb_jmp_cache[0x5e9] & 4) != 0) {
        return;
      }
      tt = 0x3f;
    }
    else {
      tt = 0x32;
    }
  }
  else if (((ulong)cs[1].tb_jmp_cache[0x436] & 4) == 0) {
    if (((*(byte *)((long)cs[1].tb_jmp_cache + 0x3059) & 8) == 0) ||
       (((ulong)cs[1].tb_jmp_cache[0x5e9] & 4) != 0)) {
      return;
    }
    tt = 0x3e;
  }
  else {
    tt = 10;
  }
  cpu_raise_exception_ra_sparc64
            ((CPUSPARCState_conflict1 *)(cs[1].tb_jmp_cache + 0x1f5),tt,
             CONCAT71(in_register_00000011,is_write));
}

Assistant:

static void sparc_raise_mmu_fault(CPUState *cs, hwaddr addr,
                                  bool is_write, bool is_exec, int is_asi,
                                  unsigned size, uintptr_t retaddr)
{
    SPARCCPU *cpu = SPARC_CPU(cs);
    CPUSPARCState *env = &cpu->env;
    int fault_type;

#ifdef DEBUG_UNASSIGNED
    if (is_asi) {
        printf("Unassigned mem %s access of %d byte%s to " TARGET_FMT_plx
               " asi 0x%02x from " TARGET_FMT_lx "\n",
               is_exec ? "exec" : is_write ? "write" : "read", size,
               size == 1 ? "" : "s", addr, is_asi, env->pc);
    } else {
        printf("Unassigned mem %s access of %d byte%s to " TARGET_FMT_plx
               " from " TARGET_FMT_lx "\n",
               is_exec ? "exec" : is_write ? "write" : "read", size,
               size == 1 ? "" : "s", addr, env->pc);
    }
#endif
    /* Don't overwrite translation and access faults */
    fault_type = (env->mmuregs[3] & 0x1c) >> 2;
    if ((fault_type > 4) || (fault_type == 0)) {
        env->mmuregs[3] = 0; /* Fault status register */
        if (is_asi) {
            env->mmuregs[3] |= 1 << 16;
        }
        if (env->psrs) {
            env->mmuregs[3] |= 1 << 5;
        }
        if (is_exec) {
            env->mmuregs[3] |= 1 << 6;
        }
        if (is_write) {
            env->mmuregs[3] |= 1 << 7;
        }
        env->mmuregs[3] |= (5 << 2) | 2;
        /* SuperSPARC will never place instruction fault addresses in the FAR */
        if (!is_exec) {
            env->mmuregs[4] = addr; /* Fault address register */
        }
    }
    /* overflow (same type fault was not read before another fault) */
    if (fault_type == ((env->mmuregs[3] & 0x1c)) >> 2) {
        env->mmuregs[3] |= 1;
    }

    if ((env->mmuregs[0] & MMU_E) && !(env->mmuregs[0] & MMU_NF)) {
        int tt = is_exec ? TT_CODE_ACCESS : TT_DATA_ACCESS;
        cpu_raise_exception_ra(env, tt, retaddr);
    }

    /*
     * flush neverland mappings created during no-fault mode,
     * so the sequential MMU faults report proper fault types
     */
    if (env->mmuregs[0] & MMU_NF) {
        tlb_flush(cs);
    }
}